

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O2

void __thiscall vsencoding::BitsWriter::bit_flush(BitsWriter *this)

{
  uint uVar1;
  uint32_t *puVar2;
  int iVar3;
  long lVar4;
  
  uVar1 = this->Fill;
  if ((ulong)uVar1 != 0) {
    if (uVar1 < 0x21) {
      puVar2 = this->data;
      this->data = puVar2 + 1;
      *puVar2 = (uint32_t)(this->buffer << (-((ulong)uVar1 + 0x20) & 0x3f));
      iVar3 = 1;
    }
    else {
      puVar2 = this->data;
      lVar4 = this->buffer << ((ulong)(byte)-(char)uVar1 & 0x3f);
      *puVar2 = (uint32_t)((ulong)lVar4 >> 0x20);
      this->data = puVar2 + 2;
      puVar2[1] = (uint32_t)lVar4;
      iVar3 = 2;
    }
    this->written = this->written + iVar3;
    this->buffer = 0;
    this->Fill = 0;
  }
  return;
}

Assistant:

inline void BitsWriter::bit_flush() {
  if (Fill == 0)
    return;

  if (Fill > 32) {
    buffer <<= 64 - Fill;
    *data++ = static_cast<uint32_t>(buffer >> 32);
    *data++ = buffer & ((1ULL << 32) - 1);
    written += 2;
    Fill = 0;
  }

  if (Fill > 0) {
    *data++ = buffer << (32 - Fill) & ((1ULL << 32) - 1);
    written++;
  }

  buffer = 0;
  Fill = 0;
}